

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
cbor_event_reader<std::__cxx11::istringstream&>
          (cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          allocator<char> *param_2,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *param_3,
          cbor_decode_options *param_4,undefined8 param_5)

{
  char cVar1;
  
  *(undefined8 *)this = 0x99a928;
  *(undefined8 *)(this + 0x2e8) = 0x99a9c8;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_cbor_parser<std::__cxx11::istringstream&>
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),param_3,param_4,param_2);
  *(undefined ***)(this + 0x280) = &PTR__basic_item_event_visitor_0099a800;
  *(undefined2 *)(this + 0x288) = 3;
  *(undefined4 *)(this + 0x2b0) = 0;
  *(undefined8 *)(this + 0x290) = 0;
  *(undefined8 *)(this + 0x298) = 0;
  *(undefined8 *)(this + 0x29c) = 0;
  *(undefined8 *)(this + 0x2a4) = 0;
  *(undefined8 *)(this + 0x2b8) = 0;
  *(undefined8 *)(this + 0x2c0) = 0;
  *(undefined8 *)(this + 0x2c8) = 0;
  *(undefined8 *)(this + 0x2d0) = 0;
  *(undefined8 *)(this + 0x2d1) = 0;
  *(undefined8 *)(this + 0x2d9) = 0;
  this[0x12] = (cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x40))(this,param_5);
  }
  return;
}

Assistant:

cbor_event_reader(std::allocator_arg_t, const Allocator& alloc, 
            Sourceable&& source,
            const cbor_decode_options& options,
            std::error_code& ec)
           : parser_(std::forward<Sourceable>(source), options, alloc),
             eof_(false)
        {
            parser_.cursor_mode(true);
            if (!done())
            {
                next(ec);
            }
        }